

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::CallIndirectExpr::CallIndirectExpr(CallIndirectExpr *this,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__Expr_002283d0;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc.filename._M_len =
       (loc->filename)._M_len;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc.filename._M_str = pcVar1;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc.field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc.field_1 + 8) =
       uVar3;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr.type_ = CallIndirect;
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_002288c8;
  (this->decl).has_func_type = false;
  Var::Var(&(this->decl).type_var);
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->decl).sig.param_type_names._M_h._M_buckets =
       &(this->decl).sig.param_type_names._M_h._M_single_bucket;
  (this->decl).sig.param_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.param_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.param_type_names._M_h._M_element_count = 0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.param_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.param_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->decl).sig.result_type_names._M_h._M_buckets =
       &(this->decl).sig.result_type_names._M_h._M_single_bucket;
  (this->decl).sig.result_type_names._M_h._M_bucket_count = 1;
  (this->decl).sig.result_type_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->decl).sig.result_type_names._M_h._M_element_count = 0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->decl).sig.result_type_names._M_h._M_rehash_policy._M_next_resize = 0;
  (this->decl).sig.result_type_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Var::Var(&this->table);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}